

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::ExpressionsIndexingScalar1<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (ExpressionsIndexingScalar1<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  long *plVar1;
  ulong *puVar2;
  TestError *pTVar3;
  long lVar4;
  long lVar5;
  long *plVar6;
  long **pplVar7;
  undefined1 *puVar8;
  long lVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string shader_source;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  ExpressionsIndexingScalar1<glcts::ArraysOfArrays::Interface::ES> *local_38;
  
  lVar9 = 0;
  local_38 = this;
  do {
    lVar4 = 0x2238c78;
    if (supported_variable_types_map._16_8_ != 0) {
      lVar4 = 0x2238c78;
      lVar5 = supported_variable_types_map._16_8_;
      do {
        if (*(int *)(Interface::ES::var_types + lVar9 * 4) <= *(int *)(lVar5 + 0x20)) {
          lVar4 = lVar5;
        }
        lVar5 = *(long *)(lVar5 + 0x10 +
                         (ulong)(*(int *)(lVar5 + 0x20) <
                                *(int *)(Interface::ES::var_types + lVar9 * 4)) * 8);
      } while (lVar5 != 0);
    }
    lVar5 = 0x2238c78;
    if ((lVar4 != 0x2238c78) &&
       (lVar5 = lVar4, *(int *)(Interface::ES::var_types + lVar9 * 4) < *(int *)(lVar4 + 0x20))) {
      lVar5 = 0x2238c78;
    }
    if (lVar5 == 0x2238c78) {
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,"Type not found.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,3000);
      __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,shader_start_abi_cxx11_,DAT_02233658 + shader_start_abi_cxx11_);
    std::__cxx11::string::append((char *)&local_78);
    plVar1 = (long *)std::__cxx11::string::_M_append((char *)&local_78,*(ulong *)(lVar5 + 0x28));
    plVar6 = plVar1 + 2;
    if ((long *)*plVar1 == plVar6) {
      local_88 = *plVar6;
      lStack_80 = plVar1[3];
      local_98 = &local_88;
    }
    else {
      local_88 = *plVar6;
      local_98 = (long *)*plVar1;
    }
    local_90 = plVar1[1];
    *plVar1 = (long)plVar6;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_98);
    local_58 = &local_48;
    plVar6 = plVar1 + 2;
    if ((long *)*plVar1 == plVar6) {
      local_48 = *plVar6;
      lStack_40 = plVar1[3];
    }
    else {
      local_48 = *plVar6;
      local_58 = (long *)*plVar1;
    }
    local_50 = plVar1[1];
    *plVar1 = (long)plVar6;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_58);
    std::__cxx11::string::append((char *)&local_58);
    std::__cxx11::string::append((char *)&local_58);
    std::operator+(&local_78,"                x[0][i][j][k] = ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (lVar5 + 0x68));
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_78);
    plVar6 = plVar1 + 2;
    if ((long *)*plVar1 == plVar6) {
      local_88 = *plVar6;
      lStack_80 = plVar1[3];
      local_98 = &local_88;
    }
    else {
      local_88 = *plVar6;
      local_98 = (long *)*plVar1;
    }
    local_90 = plVar1[1];
    *plVar1 = (long)plVar6;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_98);
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_58);
    std::__cxx11::string::append((char *)&local_58);
    std::__cxx11::string::append((char *)&local_58);
    if (TESSELATION_EVALUATION_SHADER_TYPE < tested_shader_type) {
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0xbb1);
      __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    puVar2 = &set_tesseation_abi_cxx11_;
    switch(tested_shader_type) {
    case VERTEX_SHADER_TYPE:
      std::__cxx11::string::append((char *)&local_58);
      break;
    case GEOMETRY_SHADER_TYPE:
      puVar2 = &emit_quad_abi_cxx11_;
    case TESSELATION_CONTROL_SHADER_TYPE:
      std::__cxx11::string::_M_append((char *)&local_58,*puVar2);
    }
    std::__cxx11::string::_M_append((char *)&local_58,shader_end_abi_cxx11_);
    puVar8 = empty_string_abi_cxx11_;
    pplVar7 = (long **)empty_string_abi_cxx11_;
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
      puVar8 = default_vertex_shader_source_abi_cxx11_;
      pplVar7 = &local_58;
      break;
    case VERTEX_SHADER_TYPE:
      puVar8 = (undefined1 *)&local_58;
      goto LAB_00b43167;
    case COMPUTE_SHADER_TYPE:
      break;
    case GEOMETRY_SHADER_TYPE:
    case TESSELATION_CONTROL_SHADER_TYPE:
    case TESSELATION_EVALUATION_SHADER_TYPE:
      puVar8 = default_vertex_shader_source_abi_cxx11_;
LAB_00b43167:
      pplVar7 = (long **)default_fragment_shader_source_abi_cxx11_;
      break;
    default:
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0xbb4);
      __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (*(local_38->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
      super_TestNode._vptr_TestNode[9])(local_38,puVar8,pplVar7,1,0);
    if (local_58 != &local_48) {
      operator_delete(local_58,local_48 + 1);
    }
    lVar9 = lVar9 + 1;
    if (lVar9 == 0x1c) {
      return;
    }
  } while( true );
}

Assistant:

void ExpressionsIndexingScalar1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	for (size_t var_type_index = 0; var_type_index < API::n_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(API::var_types[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string shader_source = shader_start + "    " + var_iterator->second.type + " x[1][2][3][4];\n\n";

			shader_source += "    for (uint i = 0u; i < 2u; i++) {\n";
			shader_source += "        for (uint j = 0u; j < 3u; j++) {\n";
			shader_source += "            for (uint k = 0u; k < 4u; k++) {\n";
			shader_source += "                x[0][i][j][k] = " + var_iterator->second.initializer_with_ones + ";\n";
			shader_source += "            }\n";
			shader_source += "        }\n";
			shader_source += "    }\n";

			/* End main */
			DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

			/* Execute test */
			EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
		} /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	}
}